

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

unsigned_long xmlDictComputeFastKey(xmlChar *name,int namelen,int seed)

{
  xmlChar *local_28;
  unsigned_long value;
  int seed_local;
  int namelen_local;
  xmlChar *name_local;
  
  if (name == (xmlChar *)0x0) {
    name_local = (xmlChar *)0x0;
  }
  else {
    local_28 = (xmlChar *)(((ulong)*name + (long)seed) * 0x20);
    value._4_4_ = namelen;
    if (10 < namelen) {
      local_28 = local_28 + name[namelen + -1];
      value._4_4_ = 10;
    }
    switch(value._4_4_) {
    case 10:
      local_28 = local_28 + name[9];
    case 9:
      local_28 = local_28 + name[8];
    case 8:
      local_28 = local_28 + name[7];
    case 7:
      local_28 = local_28 + name[6];
    case 6:
      local_28 = local_28 + name[5];
    case 5:
      local_28 = local_28 + name[4];
    case 4:
      local_28 = local_28 + name[3];
    case 3:
      local_28 = local_28 + name[2];
    case 2:
      local_28 = local_28 + name[1];
    default:
      name_local = local_28;
    }
  }
  return (unsigned_long)name_local;
}

Assistant:

static unsigned long
xmlDictComputeFastKey(const xmlChar *name, int namelen, int seed) {
    unsigned long value = seed;

    if (name == NULL) return(0);
    value += *name;
    value <<= 5;
    if (namelen > 10) {
        value += name[namelen - 1];
        namelen = 10;
    }
    switch (namelen) {
        case 10: value += name[9];
        /* Falls through. */
        case 9: value += name[8];
        /* Falls through. */
        case 8: value += name[7];
        /* Falls through. */
        case 7: value += name[6];
        /* Falls through. */
        case 6: value += name[5];
        /* Falls through. */
        case 5: value += name[4];
        /* Falls through. */
        case 4: value += name[3];
        /* Falls through. */
        case 3: value += name[2];
        /* Falls through. */
        case 2: value += name[1];
        /* Falls through. */
        default: break;
    }
    return(value);
}